

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capture.cpp
# Opt level: O0

bool __thiscall TestETCaptureLValueLeft::Run(TestETCaptureLValueLeft *this)

{
  undefined1 *head;
  Outputter *pOVar1;
  bool bVar2;
  ETCaptureTestValue *t;
  int *t_00;
  ETCaptureTestValue *tail;
  char (*s) [107];
  stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>
  local_248;
  char *local_240;
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<ETCaptureTestValue,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>_>
  local_238;
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<ETCaptureTestValue,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>,_const_char_*>_>
  local_208;
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<ETCaptureTestValue,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>,_const_char_*>,_const_char_*>_>
  local_1d0;
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<ETCaptureTestValue,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>,_const_char_*>,_const_char_*>,_testinator::stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>_>
  local_190;
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<ETCaptureTestValue,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>,_const_char_*>,_const_char_*>,_testinator::stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>_>
  local_148;
  testinator local_f8 [32];
  stringifier_select<ETCaptureTestValue,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>
  local_d8;
  int local_d0;
  undefined1 local_c9 [9];
  Cons<std::pair<testinator::Nil,_const_char_*>_> *local_c0;
  Cons<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>_> local_b8;
  Cons<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>_> local_a0;
  undefined1 local_80 [8];
  Cons<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<ETCaptureTestValue,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>_>
  diag;
  undefined1 local_41 [9];
  Capture<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_ETCaptureTestValue_&>_>
  *local_38;
  undefined1 local_30 [8];
  Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_ETCaptureTestValue_&>,_testinator::EQOp,_int>_>
  cap;
  ETCaptureTestValue v;
  TestETCaptureLValueLeft *this_local;
  
  head = &cap.m_list.m_pair.field_0x14;
  ETCaptureTestValue::ETCaptureTestValue((ETCaptureTestValue *)head);
  local_41[0] = 0;
  local_38 = testinator::operator->*
                       ((Capture<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_ETCaptureTestValue_&>_>
                         *)local_41,(Capture<testinator::Nothing> *)head,tail);
  diag.m_list.second.m_t._0_4_ = 0;
  testinator::operator==
            ((Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_ETCaptureTestValue_&>,_testinator::EQOp,_int>_>
              *)local_30,
             (Capture<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_ETCaptureTestValue_&>_>
              *)(local_41 + 1),(int *)&diag.m_list.second);
  bVar2 = testinator::
          Eval<testinator::Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,testinator::SecondOp,ETCaptureTestValue&>,testinator::EQOp,int>>&>
                    ((Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_ETCaptureTestValue_&>,_testinator::EQOp,_int>_>
                      *)local_30);
  if (!bVar2) {
    local_c9[0] = 0;
    local_c0 = testinator::operator<<
                         ((Cons<std::pair<testinator::Nil,_const_char_*>_> *)local_c9,
                          (Cons<testinator::Nil> *)
                          "EXPECT FAILED: /workspace/llm4binary/github/license_c_cmakelists/elbeno[P]testinator/src/test/capture.cpp:"
                          ,s);
    local_d0 = 0x25;
    testinator::operator<<
              (&local_b8,(Cons<std::pair<testinator::Nil,_const_char_*>_> *)(local_c9 + 1),&local_d0
              );
    testinator::operator<<(&local_a0,&local_b8,(char (*) [13])" (v == 0 => ");
    t = testinator::
        LHS<testinator::Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,testinator::SecondOp,ETCaptureTestValue&>,testinator::EQOp,int>>&>
                  ((Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_ETCaptureTestValue_&>,_testinator::EQOp,_int>_>
                    *)local_30);
    local_d8.m_t = (ETCaptureTestValue *)testinator::prettyprint<ETCaptureTestValue&>(t);
    testinator::operator<<
              ((Cons<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<ETCaptureTestValue,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>_>
                *)local_80,&local_a0,&local_d8);
    pOVar1 = (this->super_Test).m_op;
    testinator::operator<<
              (&local_238,
               (Cons<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<ETCaptureTestValue,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>_>
                *)local_80,(char (*) [2])0x274595);
    local_240 = testinator::
                RelOp<testinator::Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,testinator::SecondOp,ETCaptureTestValue&>,testinator::EQOp,int>>&>
                          ((Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_ETCaptureTestValue_&>,_testinator::EQOp,_int>_>
                            *)local_30);
    testinator::operator<<(&local_208,&local_238,&local_240);
    testinator::operator<<(&local_1d0,&local_208,(char (*) [2])0x274595);
    t_00 = testinator::
           RHS<testinator::Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,testinator::SecondOp,ETCaptureTestValue&>,testinator::EQOp,int>>&>
                     ((Capture<testinator::OpPair<testinator::OpPair<testinator::Nothing,_testinator::SecondOp,_ETCaptureTestValue_&>,_testinator::EQOp,_int>_>
                       *)local_30);
    local_248.m_t = (int *)testinator::prettyprint<int>(t_00);
    testinator::operator<<(&local_190,&local_1d0,&local_248);
    testinator::operator<<(&local_148,&local_190,(char (*) [2])0x275bda);
    testinator::
    Diagnostic<testinator::Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,char_const*>,int>,char_const*>,testinator::stringifier_select<ETCaptureTestValue,testinator::default_formatter,testinator::detail::is_outputtable_tag>>,char_const*>,char_const*>,char_const*>,testinator::stringifier_select<int,testinator::default_formatter,testinator::detail::is_outputtable_tag>>,char_const*>>>
              (local_f8,&local_148);
    (*pOVar1->_vptr_Outputter[3])(pOVar1,local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    (this->super_Test).m_success = false;
  }
  ETCaptureTestValue::~ETCaptureTestValue((ETCaptureTestValue *)&cap.m_list.m_pair.field_0x14);
  return true;
}

Assistant:

virtual bool Run()
  {
    ETCaptureTestValue v;
    EXPECT(v == 0);
    return true;
  }